

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::ZoneBitVector::copyFrom
          (ZoneBitVector *this,ZoneAllocator *allocator,ZoneBitVector *other)

{
  uint uVar1;
  void *p;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  size_t allocatedCapacity;
  
  uVar1 = *(uint *)(other + 8);
  if (uVar1 == 0) {
    *(undefined4 *)(this + 8) = 0;
    return 0;
  }
  p = *(void **)this;
  pvVar3 = p;
  if (*(uint *)(this + 0xc) < uVar1) {
    uVar5 = uVar1 + 0x3f & 0xffffffc0;
    if (uVar5 < uVar1) {
      return 1;
    }
    pvVar3 = ZoneAllocator::alloc(allocator,(ulong)(uVar5 >> 3),&allocatedCapacity);
    if (pvVar3 == (void *)0x0) {
      return 1;
    }
    uVar4 = allocatedCapacity * 8;
    if (uVar4 < allocatedCapacity) {
      uVar4 = (ulong)uVar5;
    }
    if (p != (void *)0x0) {
      ZoneAllocator::release(allocator,p,(ulong)(*(uint *)(this + 0xc) >> 3));
    }
    *(void **)this = pvVar3;
    *(int *)(this + 0xc) = (int)uVar4;
  }
  *(uint *)(this + 8) = uVar1;
  lVar2 = *(long *)other;
  for (uVar4 = 0; uVar1 + 0x3f >> 6 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined8 *)((long)pvVar3 + uVar4 * 8) = *(undefined8 *)(lVar2 + uVar4 * 8);
  }
  return 0;
}

Assistant:

Error ZoneBitVector::copyFrom(ZoneAllocator* allocator, const ZoneBitVector& other) noexcept {
  BitWord* data = _data;
  uint32_t newSize = other.size();

  if (!newSize) {
    _size = 0;
    return kErrorOk;
  }

  if (newSize > _capacity) {
    // Realloc needed... Calculate the minimum capacity (in bytes) required.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(newSize, kBitWordSizeInBits);
    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  _size = newSize;
  _copyBits(data, other.data(), _wordsPerBits(newSize));

  return kErrorOk;
}